

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_InitClassMemberGet<Js::OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  PropertyId propertyId;
  Var object;
  Var getter;
  OpLayoutT_ElementC<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  object = GetReg<unsigned_char>(this,playout->Instance);
  propertyId = FunctionBody::GetReferencedPropertyId
                         (*(FunctionBody **)(this + 0x88),(uint)playout->PropertyIdIndex);
  getter = GetReg<unsigned_char>(this,playout->Value);
  Js::JavascriptOperators::OP_InitClassMemberGet(object,propertyId,getter);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitClassMemberGet(const unaligned T * playout)
    {
        JavascriptOperators::OP_InitClassMemberGet(
            GetReg(playout->Instance),
            m_functionBody->GetReferencedPropertyId(playout->PropertyIdIndex),
            GetReg(playout->Value));
    }